

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RhoR.cpp
# Opt level: O3

void __thiscall OpenMD::RhoR::writeRhoR(RhoR *this)

{
  char cVar1;
  ostream *poVar2;
  ulong uVar3;
  ofstream rdfStream;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream
            (&local_230,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    snprintf(painCave.errMsg,2000,"RhoR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"#radial density function rho(r)\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"#r\tcorrValue\n",0xd);
    if ((this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        poVar2 = std::ostream::_M_insert<double>(((double)uVar3 + 0.5) * this->deltaR_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\t",1);
        poVar2 = std::ostream::_M_insert<double>
                           ((this->avgRhoR_).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar3] /
                            (double)this->nProcessed_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (uVar3 < (ulong)((long)(this->avgRhoR_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(this->avgRhoR_).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 3));
    }
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void RhoR::writeRhoR() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#radial density function rho(r)\n";
      rdfStream << "#r\tcorrValue\n";
      for (unsigned int i = 0; i < avgRhoR_.size(); ++i) {
        RealType r = deltaR_ * (i + 0.5);
        rdfStream << r << "\t" << avgRhoR_[i] / nProcessed_ << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RhoR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }